

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_time.c
# Opt level: O1

int64_t dos_to_unix(uint32_t dos_time)

{
  time_t tVar1;
  tm ts;
  tm local_38;
  
  local_38.tm_year = (dos_time >> 0x19) + 0x50;
  local_38.tm_mon = (dos_time >> 0x15 & 0xf) - 1;
  local_38.tm_mday = dos_time >> 0x10 & 0x1f;
  local_38.tm_hour = dos_time >> 0xb & 0x1f;
  local_38.tm_min = dos_time >> 5 & 0x3f;
  local_38.tm_sec = dos_time * 2 & 0x3e;
  local_38.tm_isdst = -1;
  tVar1 = mktime(&local_38);
  return tVar1;
}

Assistant:

int64_t
dos_to_unix(uint32_t dos_time)
{
	uint16_t msTime, msDate;
	struct tm ts;

	msTime = (0xFFFF & dos_time);
	msDate = (dos_time >> 16);
	ts.tm_year = ((msDate >> 9) & 0x7f) + 80; /* Years since 1900. */
	ts.tm_mon = ((msDate >> 5) & 0x0f) - 1; /* Month number. */
	ts.tm_mday = msDate & 0x1f; /* Day of month. */
	ts.tm_hour = (msTime >> 11) & 0x1f;
	ts.tm_min = (msTime >> 5) & 0x3f;
	ts.tm_sec = (msTime << 1) & 0x3e;
	ts.tm_isdst = -1;
	return mktime(&ts);
}